

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticFundamentalParameterData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  UnderwaterAcousticFundamentalParameterData *local_18;
  UnderwaterAcousticFundamentalParameterData *this_local;
  
  local_18 = this;
  this_local = (UnderwaterAcousticFundamentalParameterData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Underwater Acoustic Fundamental Parameter Data:");
  poVar1 = std::operator<<(poVar1,"\n\tAEPI:                ");
  ENUMS::GetEnumAsStringActiveEmissionParameterIndex_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16AEPI,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tScan Pattern:        ");
  ENUMS::GetEnumAsStringScanPattern_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui16ScanPattern,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Center Azimuth: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamCenterAzimuth);
  poVar1 = std::operator<<(poVar1,"\n\tAzimuthal Beamwidth: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32AzimuthalBeamWidth);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Center D/E:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamCenterDE);
  poVar1 = std::operator<<(poVar1,"\n\tD/E Beamwidth:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32DEBeamwidth);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticFundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Fundamental Parameter Data:"
       << "\n\tAEPI:                " << GetEnumAsStringActiveEmissionParameterIndex( m_ui16AEPI )
       << "\n\tScan Pattern:        " << GetEnumAsStringScanPattern( m_ui16ScanPattern )
       << "\n\tBeam Center Azimuth: " << m_f32BeamCenterAzimuth
       << "\n\tAzimuthal Beamwidth: " << m_f32AzimuthalBeamWidth
       << "\n\tBeam Center D/E:     " << m_f32BeamCenterDE
       << "\n\tD/E Beamwidth:       " << m_f32DEBeamwidth
       << "\n";

    return ss.str();
}